

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

P __thiscall ccs::ParserImpl::parseTerm(ParserImpl *this)

{
  Type TVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ParserImpl *in_RSI;
  P PVar4;
  undefined1 local_60 [32];
  __shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  PVar4 = parseStep(this);
  _Var3 = PVar4.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  while ((((in_RSI->cur_).type == GT && (TVar1 = (in_RSI->lex_).next_.type, TVar1 < (STRING|LPAREN))
          ) && ((0x140002U >> (TVar1 & (INT|OVERRIDE)) & 1) != 0))) {
    advance(in_RSI);
    plVar2 = (long *)(this->fileName_)._M_dataplus._M_p;
    std::__shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x10)
               ,(__shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2> *)this);
    parseStep((ParserImpl *)local_60);
    (**(code **)(*plVar2 + 0x18))
              (&local_40,plVar2,
               (__shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x10)
               ,(ParserImpl *)local_60);
    std::__shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2> *)this,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x18));
    _Var3._M_pi = extraout_RDX;
  }
  PVar4.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  PVar4.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (P)PVar4.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ast::SelectorLeaf::P parseTerm() {
    auto left = parseStep();
    while (cur_.type == Token::GT) {
      // here we have to distinguish another step from a trailing '>'. again,
      // peeking for ident or '(' does the trick.
      if (!couldStartStep(lex_.peek())) return left;
      advance();
      left = left->descendant(left, parseStep());
    }
    return left;
  }